

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_gm_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  int iVar1;
  AV1_COMP *cpi_00;
  long lVar2;
  long *plVar3;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MultiThreadInfo *mt_info;
  undefined4 in_stack_ffffffffffffffd8;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x9ae48);
  *(undefined1 *)(in_RDI + 0x9d178) = 0;
  for (iVar1 = in_EDX + -1; -1 < iVar1; iVar1 = iVar1 + -1) {
    lVar2 = *(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 4) + (long)iVar1 * 0x38
    ;
    plVar3 = (long *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[3] +
                     (long)iVar1 * 0x1d0);
    *(undefined8 *)(lVar2 + 0x18) = in_RSI;
    *(long **)(lVar2 + 0x20) = plVar3;
    *(undefined8 *)(lVar2 + 0x28) = 0;
    *(int *)((long)plVar3 + 0x1cc) = iVar1;
    *(int *)(plVar3 + 0x39) = iVar1;
    *plVar3 = in_RDI;
    if (iVar1 == 0) {
      plVar3[1] = in_RDI + 0x15030;
    }
    else {
      plVar3[1] = plVar3[2];
    }
    if (plVar3[1] != in_RDI + 0x15030) {
      gm_alloc_data(cpi_00,(GlobalMotionData *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
  }
  return;
}

Assistant:

static inline void prepare_gm_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                                      int num_workers) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  mt_info->gm_sync.gm_mt_exit = false;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *worker = &mt_info->workers[i];
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    if (thread_data->td != &cpi->td)
      gm_alloc_data(cpi, &thread_data->td->gm_data);
  }
}